

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_compare_firstLessThanSecond_fn(int _i)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  char **ppcVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined8 uStack_f0;
  AString string2;
  AString string4;
  AString string3;
  AString string1;
  
  string1.reallocator = private_ACUtilsTest_AString_realloc;
  string1.deallocator = private_ACUtilsTest_AString_free;
  string1.size = 0;
  string1.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_f0 = 0x146925;
  string1.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  *string1.buffer = '\0';
  string2.reallocator = private_ACUtilsTest_AString_realloc;
  string2.deallocator = private_ACUtilsTest_AString_free;
  string2.size = 1;
  string2.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_f0 = 0x146969;
  string2.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  string2.buffer[0] = 'a';
  string2.buffer[1] = '\0';
  string3.reallocator = private_ACUtilsTest_AString_realloc;
  string3.deallocator = private_ACUtilsTest_AString_free;
  string3.size = 1;
  string3.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_f0 = 0x1469a9;
  string3.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  string3.buffer[0] = 'b';
  string3.buffer[1] = '\0';
  string4.reallocator = private_ACUtilsTest_AString_realloc;
  string4.deallocator = private_ACUtilsTest_AString_free;
  string4.size = 2;
  string4.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_f0 = 0x1469f1;
  string4.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  string4.buffer[2] = '\0';
  string4.buffer[0] = 'b';
  string4.buffer[1] = 'a';
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_f0 = 0x146a1f;
  uVar1 = AString_compare(&string1,&string2);
  if (-1 < (int)uVar1) {
    local_108 = (char *)(ulong)uVar1;
    ppcVar4 = &local_108;
    local_100 = "0";
    pcVar3 = "Assertion \'_ck_x < _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
    pcVar6 = "AString_compare(&string1, &string2) < 0";
    pcVar7 = "AString_compare(&string1, &string2)";
    iVar5 = 0x8d2;
    goto LAB_00147a7d;
  }
  uStack_f0 = 0x146a38;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8d2);
  if (string1.capacity != 8) {
    pcVar2 = "(string1).capacity == (8)";
    pcVar3 = "(string1).capacity";
    iVar5 = 0x8d3;
    local_108 = (char *)string1.capacity;
    goto LAB_0014794f;
  }
  uStack_f0 = 0x146a5b;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8d3);
  if (string1.buffer == (char *)0x0) {
    ppcVar4 = &local_f8;
    pcVar3 = "Assertion \'_ck_x != NULL\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %#x";
    pcVar6 = "(void*) (string1).buffer != NULL";
    pcVar7 = "(void*) (string1).buffer";
  }
  else {
    uStack_f0 = 0x146a7b;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x8d3);
    if (string1.buffer == (char *)0x0) {
      pcVar2 = "(null)";
      pcVar3 = "";
LAB_001470f7:
      uStack_f0 = 0;
      local_f8 = "\"";
      local_100 = "";
      local_108 = "\"";
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x8d3,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(string1).buffer == (\"\")","(string1).buffer",pcVar3,pcVar2,pcVar3,
                        "(\"\")");
    }
    if (*string1.buffer != '\0') {
      pcVar3 = "\"";
      pcVar2 = string1.buffer;
      goto LAB_001470f7;
    }
    uStack_f0 = 0x146aae;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x8d3);
    if (string1.size == 0) {
      uStack_f0 = 0x146ad0;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8d3);
      if (string2.capacity != 8) {
        pcVar2 = "(string2).capacity == (8)";
        pcVar3 = "(string2).capacity";
        iVar5 = 0x8d4;
        local_108 = (char *)string2.capacity;
        goto LAB_0014794f;
      }
      uStack_f0 = 0x146af0;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8d4);
      if (string2.buffer == (char *)0x0) {
        ppcVar4 = &local_f8;
        pcVar3 = "Assertion \'_ck_x != NULL\' failed";
        pcVar2 = "Assertion \'%s\' failed: %s == %#x";
        pcVar6 = "(void*) (string2).buffer != NULL";
        pcVar7 = "(void*) (string2).buffer";
        iVar5 = 0x8d4;
        goto LAB_00147a7d;
      }
      uStack_f0 = 0x146b0d;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8d4);
      if (string2.buffer == (char *)0x0) {
        pcVar3 = "";
        pcVar2 = "(null)";
      }
      else {
        uVar1 = (byte)*string2.buffer - 0x61;
        if (uVar1 == 0) {
          uVar1 = (uint)(byte)string2.buffer[1];
        }
        if (uVar1 == 0) {
          uStack_f0 = 0x146b44;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8d4);
          if (string2.size != 1) {
            local_100 = "strlen(\"a\")";
            pcVar2 = "(string2).size == strlen(\"a\")";
            pcVar3 = "(string2).size";
            iVar5 = 0x8d4;
            local_108 = (char *)string2.size;
            goto LAB_00147918;
          }
          uStack_f0 = 0x146b64;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8d4);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            ppcVar4 = &local_108;
            local_100 = "(0)";
            local_108 = (char *)private_ACUtilsTest_AString_reallocCount;
            pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar6 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar7 = "private_ACUtilsTest_AString_reallocCount";
            iVar5 = 0x8d5;
            goto LAB_00147a7d;
          }
          uStack_f0 = 0x146b85;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8d5);
          uStack_f0 = 0x146b92;
          uVar1 = AString_compare(&string2,&string3);
          if (-1 < (int)uVar1) {
            local_108 = (char *)(ulong)uVar1;
            ppcVar4 = &local_108;
            local_100 = "0";
            pcVar3 = "Assertion \'_ck_x < _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar6 = "AString_compare(&string2, &string3) < 0";
            pcVar7 = "AString_compare(&string2, &string3)";
            iVar5 = 0x8d6;
            goto LAB_00147a7d;
          }
          uStack_f0 = 0x146bab;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8d6);
          if (string2.capacity != 8) {
            pcVar2 = "(string2).capacity == (8)";
            pcVar3 = "(string2).capacity";
            iVar5 = 0x8d7;
            local_108 = (char *)string2.capacity;
            goto LAB_0014794f;
          }
          uStack_f0 = 0x146bcb;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8d7);
          if (string2.buffer == (char *)0x0) {
            ppcVar4 = &local_f8;
            pcVar3 = "Assertion \'_ck_x != NULL\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %#x";
            pcVar6 = "(void*) (string2).buffer != NULL";
            pcVar7 = "(void*) (string2).buffer";
            iVar5 = 0x8d7;
            goto LAB_00147a7d;
          }
          uStack_f0 = 0x146be8;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8d7);
          if (string2.buffer == (char *)0x0) {
            pcVar3 = "";
            pcVar2 = "(null)";
          }
          else {
            uVar1 = (byte)*string2.buffer - 0x61;
            if (uVar1 == 0) {
              uVar1 = (uint)(byte)string2.buffer[1];
            }
            if (uVar1 == 0) {
              uStack_f0 = 0x146c1f;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8d7);
              if (string2.size != 1) {
                local_100 = "strlen(\"a\")";
                pcVar2 = "(string2).size == strlen(\"a\")";
                pcVar3 = "(string2).size";
                iVar5 = 0x8d7;
                local_108 = (char *)string2.size;
LAB_00147918:
                local_f8 = (char *)0x1;
                goto LAB_00147955;
              }
              uStack_f0 = 0x146c3f;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8d7);
              if (string3.capacity != 8) {
                pcVar2 = "(string3).capacity == (8)";
                pcVar3 = "(string3).capacity";
                iVar5 = 0x8d8;
                local_108 = (char *)string3.capacity;
                goto LAB_0014794f;
              }
              uStack_f0 = 0x146c5f;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8d8);
              if (string3.buffer == (char *)0x0) {
                ppcVar4 = &local_f8;
                pcVar3 = "Assertion \'_ck_x != NULL\' failed";
                pcVar2 = "Assertion \'%s\' failed: %s == %#x";
                pcVar6 = "(void*) (string3).buffer != NULL";
                pcVar7 = "(void*) (string3).buffer";
                iVar5 = 0x8d8;
                goto LAB_00147a7d;
              }
              uStack_f0 = 0x146c7f;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8d8);
              if (string3.buffer == (char *)0x0) {
                pcVar3 = "";
                pcVar2 = "(null)";
              }
              else {
                uVar1 = (byte)*string3.buffer - 0x62;
                if (uVar1 == 0) {
                  uVar1 = (uint)(byte)string3.buffer[1];
                }
                if (uVar1 == 0) {
                  uStack_f0 = 0x146cb9;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8d8);
                  if (string3.size != 1) {
                    local_100 = "strlen(\"b\")";
                    pcVar2 = "(string3).size == strlen(\"b\")";
                    pcVar3 = "(string3).size";
                    iVar5 = 0x8d8;
                    local_108 = (char *)string3.size;
                    goto LAB_00147918;
                  }
                  uStack_f0 = 0x146cd9;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8d8);
                  if (private_ACUtilsTest_AString_reallocCount != 0) {
                    ppcVar4 = &local_108;
                    local_100 = "(0)";
                    local_108 = (char *)private_ACUtilsTest_AString_reallocCount;
                    pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar6 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar7 = "private_ACUtilsTest_AString_reallocCount";
                    iVar5 = 0x8d9;
                    goto LAB_00147a7d;
                  }
                  uStack_f0 = 0x146cfa;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8d9);
                  uStack_f0 = 0x146d07;
                  uVar1 = AString_compare(&string2,&string4);
                  if (-1 < (int)uVar1) {
                    local_108 = (char *)(ulong)uVar1;
                    ppcVar4 = &local_108;
                    local_100 = "0";
                    pcVar3 = "Assertion \'_ck_x < _ck_y\' failed";
                    pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
                    pcVar6 = "AString_compare(&string2, &string4) < 0";
                    pcVar7 = "AString_compare(&string2, &string4)";
                    iVar5 = 0x8da;
                    goto LAB_00147a7d;
                  }
                  uStack_f0 = 0x146d20;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8da);
                  if (string2.capacity != 8) {
                    pcVar2 = "(string2).capacity == (8)";
                    pcVar3 = "(string2).capacity";
                    iVar5 = 0x8db;
                    local_108 = (char *)string2.capacity;
                    goto LAB_0014794f;
                  }
                  uStack_f0 = 0x146d40;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8db);
                  if (string2.buffer == (char *)0x0) {
                    ppcVar4 = &local_f8;
                    pcVar3 = "Assertion \'_ck_x != NULL\' failed";
                    pcVar2 = "Assertion \'%s\' failed: %s == %#x";
                    pcVar6 = "(void*) (string2).buffer != NULL";
                    pcVar7 = "(void*) (string2).buffer";
                    iVar5 = 0x8db;
                    goto LAB_00147a7d;
                  }
                  uStack_f0 = 0x146d5d;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8db);
                  if (string2.buffer == (char *)0x0) {
                    pcVar3 = "";
                    pcVar2 = "(null)";
                  }
                  else {
                    uVar1 = (byte)*string2.buffer - 0x61;
                    if (uVar1 == 0) {
                      uVar1 = (uint)(byte)string2.buffer[1];
                    }
                    if (uVar1 == 0) {
                      uStack_f0 = 0x146d94;
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8db);
                      if (string2.size != 1) {
                        local_100 = "strlen(\"a\")";
                        pcVar2 = "(string2).size == strlen(\"a\")";
                        pcVar3 = "(string2).size";
                        iVar5 = 0x8db;
                        local_108 = (char *)string2.size;
                        goto LAB_00147918;
                      }
                      uStack_f0 = 0x146db4;
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8db);
                      if (string4.capacity != 8) {
                        pcVar2 = "(string4).capacity == (8)";
                        pcVar3 = "(string4).capacity";
                        iVar5 = 0x8dc;
                        local_108 = (char *)string4.capacity;
                        goto LAB_0014794f;
                      }
                      uStack_f0 = 0x146dd4;
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8dc);
                      if (string4.buffer == (char *)0x0) {
                        ppcVar4 = &local_f8;
                        pcVar3 = "Assertion \'_ck_x != NULL\' failed";
                        pcVar2 = "Assertion \'%s\' failed: %s == %#x";
                        pcVar6 = "(void*) (string4).buffer != NULL";
                        pcVar7 = "(void*) (string4).buffer";
                        iVar5 = 0x8dc;
                        goto LAB_00147a7d;
                      }
                      uStack_f0 = 0x146df1;
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x8dc);
                      if (string4.buffer == (char *)0x0) {
                        pcVar3 = "";
                        pcVar2 = "(null)";
                      }
                      else {
                        uVar1 = (byte)*string4.buffer - 0x62;
                        if ((uVar1 == 0) && (uVar1 = (byte)string4.buffer[1] - 0x61, uVar1 == 0)) {
                          uVar1 = (uint)(byte)string4.buffer[2];
                        }
                        if (uVar1 == 0) {
                          uStack_f0 = 0x146e32;
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8dc);
                          if (string4.size != 2) {
                            iVar5 = 0x8dc;
LAB_00147a2e:
                            local_100 = "strlen(\"ba\")";
                            pcVar3 = "(string4).size";
                            pcVar2 = "(string4).size == strlen(\"ba\")";
                            local_f8 = (char *)0x2;
                            local_108 = (char *)string4.size;
                            goto LAB_00147955;
                          }
                          uStack_f0 = 0x146e52;
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8dc);
                          if (private_ACUtilsTest_AString_reallocCount != 0) {
                            ppcVar4 = &local_108;
                            local_100 = "(0)";
                            local_108 = (char *)private_ACUtilsTest_AString_reallocCount;
                            pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar6 = "private_ACUtilsTest_AString_reallocCount == (0)";
                            pcVar7 = "private_ACUtilsTest_AString_reallocCount";
                            iVar5 = 0x8dd;
                            goto LAB_00147a7d;
                          }
                          uStack_f0 = 0x146e73;
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8dd);
                          uStack_f0 = 0x146e82;
                          uVar1 = AString_compare(&string3,&string4);
                          if (-1 < (int)uVar1) {
                            local_108 = (char *)(ulong)uVar1;
                            ppcVar4 = &local_108;
                            local_100 = "0";
                            pcVar3 = "Assertion \'_ck_x < _ck_y\' failed";
                            pcVar2 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
                            pcVar6 = "AString_compare(&string3, &string4) < 0";
                            pcVar7 = "AString_compare(&string3, &string4)";
                            iVar5 = 0x8de;
                            goto LAB_00147a7d;
                          }
                          uStack_f0 = 0x146e9b;
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8de);
                          if (string3.capacity != 8) {
                            pcVar2 = "(string3).capacity == (8)";
                            pcVar3 = "(string3).capacity";
                            iVar5 = 0x8df;
                            local_108 = (char *)string3.capacity;
LAB_0014794f:
                            local_100 = "(8)";
                            local_f8 = (char *)0x8;
LAB_00147955:
                            uStack_f0 = 0;
                            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,iVar5,"Assertion \'_ck_x == _ck_y\' failed",
                                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar2
                                              ,pcVar3);
                          }
                          uStack_f0 = 0x146ebb;
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8df);
                          if (string3.buffer == (char *)0x0) {
                            ppcVar4 = &local_f8;
                            pcVar3 = "Assertion \'_ck_x != NULL\' failed";
                            pcVar2 = "Assertion \'%s\' failed: %s == %#x";
                            pcVar6 = "(void*) (string3).buffer != NULL";
                            pcVar7 = "(void*) (string3).buffer";
                            iVar5 = 0x8df;
                            goto LAB_00147a7d;
                          }
                          uStack_f0 = 0x146edb;
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x8df);
                          if (string3.buffer == (char *)0x0) {
                            pcVar2 = "(null)";
                            pcVar3 = "";
                          }
                          else {
                            uVar1 = (byte)*string3.buffer - 0x62;
                            if (uVar1 == 0) {
                              uVar1 = (uint)(byte)string3.buffer[1];
                            }
                            if (uVar1 == 0) {
                              uStack_f0 = 0x146f15;
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x8df);
                              if (string3.size != 1) {
                                local_100 = "strlen(\"b\")";
                                pcVar2 = "(string3).size == strlen(\"b\")";
                                pcVar3 = "(string3).size";
                                iVar5 = 0x8df;
                                local_108 = (char *)string3.size;
                                goto LAB_00147918;
                              }
                              uStack_f0 = 0x146f35;
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x8df);
                              if (string4.capacity == 8) {
                                uStack_f0 = 0x146f55;
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0x8e0);
                                if (string4.buffer == (char *)0x0) {
                                  ppcVar4 = &local_f8;
                                  pcVar3 = "Assertion \'_ck_x != NULL\' failed";
                                  pcVar2 = "Assertion \'%s\' failed: %s == %#x";
                                  pcVar6 = "(void*) (string4).buffer != NULL";
                                  pcVar7 = "(void*) (string4).buffer";
                                  iVar5 = 0x8e0;
                                  goto LAB_00147a7d;
                                }
                                uStack_f0 = 0x146f72;
                                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                            ,0x8e0);
                                if (string4.buffer == (char *)0x0) {
                                  pcVar2 = "(null)";
                                  pcVar3 = "";
                                }
                                else {
                                  uVar1 = (byte)*string4.buffer - 0x62;
                                  if ((uVar1 == 0) &&
                                     (uVar1 = (byte)string4.buffer[1] - 0x61, uVar1 == 0)) {
                                    uVar1 = (uint)(byte)string4.buffer[2];
                                  }
                                  if (uVar1 == 0) {
                                    uStack_f0 = 0x146fb3;
                                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0x8e0);
                                    if (string4.size == 2) {
                                      uStack_f0 = 0x146fd3;
                                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8e0);
                                      if (private_ACUtilsTest_AString_reallocCount == 0) {
                                        uStack_f0 = 0x146ff4;
                                        _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x8e1);
                                        uStack_f0 = 0x147003;
                                        (*string1.deallocator)(string1.buffer);
                                        uStack_f0 = 0x14700c;
                                        (*string2.deallocator)(string2.buffer);
                                        uStack_f0 = 0x147018;
                                        (*string3.deallocator)(string3.buffer);
                                        uStack_f0 = 0x147021;
                                        (*string4.deallocator)(string4.buffer);
                                        return;
                                      }
                                      ppcVar4 = &local_108;
                                      local_100 = "(0)";
                                      local_108 = (char *)private_ACUtilsTest_AString_reallocCount;
                                      pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
                                      pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                      pcVar6 = "private_ACUtilsTest_AString_reallocCount == (0)";
                                      pcVar7 = "private_ACUtilsTest_AString_reallocCount";
                                      iVar5 = 0x8e1;
                                      goto LAB_00147a7d;
                                    }
                                    iVar5 = 0x8e0;
                                    goto LAB_00147a2e;
                                  }
                                  pcVar3 = "\"";
                                  pcVar2 = string4.buffer;
                                }
                                local_100 = "ba";
                                pcVar8 = "(\"ba\")";
                                pcVar6 = "(string4).buffer == (\"ba\")";
                                pcVar7 = "(string4).buffer";
                                iVar5 = 0x8e0;
                                goto LAB_001479ea;
                              }
                              pcVar2 = "(string4).capacity == (8)";
                              pcVar3 = "(string4).capacity";
                              iVar5 = 0x8e0;
                              local_108 = (char *)string4.capacity;
                              goto LAB_0014794f;
                            }
                            pcVar3 = "\"";
                            pcVar2 = string3.buffer;
                          }
                          local_100 = "b";
                          pcVar8 = "(\"b\")";
                          pcVar6 = "(string3).buffer == (\"b\")";
                          pcVar7 = "(string3).buffer";
                          iVar5 = 0x8df;
                          goto LAB_001479ea;
                        }
                        pcVar3 = "\"";
                        pcVar2 = string4.buffer;
                      }
                      local_100 = "ba";
                      pcVar8 = "(\"ba\")";
                      pcVar6 = "(string4).buffer == (\"ba\")";
                      pcVar7 = "(string4).buffer";
                      iVar5 = 0x8dc;
                      goto LAB_001479ea;
                    }
                    pcVar3 = "\"";
                    pcVar2 = string2.buffer;
                  }
                  local_100 = "a";
                  pcVar8 = "(\"a\")";
                  pcVar6 = "(string2).buffer == (\"a\")";
                  pcVar7 = "(string2).buffer";
                  iVar5 = 0x8db;
                  goto LAB_001479ea;
                }
                pcVar3 = "\"";
                pcVar2 = string3.buffer;
              }
              local_100 = "b";
              pcVar8 = "(\"b\")";
              pcVar6 = "(string3).buffer == (\"b\")";
              pcVar7 = "(string3).buffer";
              iVar5 = 0x8d8;
              goto LAB_001479ea;
            }
            pcVar3 = "\"";
            pcVar2 = string2.buffer;
          }
          local_100 = "a";
          pcVar8 = "(\"a\")";
          pcVar6 = "(string2).buffer == (\"a\")";
          pcVar7 = "(string2).buffer";
          iVar5 = 0x8d7;
          goto LAB_001479ea;
        }
        pcVar3 = "\"";
        pcVar2 = string2.buffer;
      }
      local_100 = "a";
      pcVar8 = "(\"a\")";
      pcVar6 = "(string2).buffer == (\"a\")";
      pcVar7 = "(string2).buffer";
      iVar5 = 0x8d4;
LAB_001479ea:
      uStack_f0 = 0;
      local_f8 = "\"";
      local_108 = "\"";
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar5,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",pcVar6,pcVar7,pcVar3,
                        pcVar2,pcVar3,pcVar8);
    }
    ppcVar4 = &local_108;
    local_100 = "strlen(\"\")";
    local_108 = (char *)string1.size;
    pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar6 = "(string1).size == strlen(\"\")";
    pcVar7 = "(string1).size";
  }
  iVar5 = 0x8d3;
LAB_00147a7d:
  uStack_f0 = 0;
  local_f8 = (char *)0x0;
  *(code **)((long)ppcVar4 + -8) = test_AString_compare_firstGreaterThanSecond_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar5,pcVar3,pcVar2,pcVar6,pcVar7);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}